

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void http_server_acccb(void *arg)

{
  nng_err nVar1;
  http_sconn *phStack_30;
  int rv;
  http_sconn *sc;
  nng_stream *stream;
  nni_aio *aio;
  nni_http_server *s;
  void *arg_local;
  
  stream = (nng_stream *)((long)arg + 0x100);
  aio = (nni_aio *)arg;
  s = (nni_http_server *)arg;
  nni_mtx_lock((nni_mtx *)((long)arg + 0xd0));
  nVar1 = nni_aio_result((nni_aio *)stream);
  if (nVar1 == NNG_OK) {
    sc = (http_sconn *)nni_aio_get_output((nni_aio *)stream,0);
    if ((aio->a_iov[4].iov_len & 1) == 0) {
      nVar1 = http_sconn_init(&stack0xffffffffffffffd0,(nng_stream *)sc);
      if (nVar1 == NNG_OK) {
        phStack_30->server = (nni_http_server *)aio;
        nni_list_append((nni_list *)&aio->a_iov[0].iov_len,phStack_30);
        phStack_30->handler = (nni_http_handler *)0x0;
        nni_http_read_req(phStack_30->conn,&phStack_30->rxaio);
        nng_stream_listener_accept((nng_stream_listener *)aio[1].a_iov[5].iov_buf,(nng_aio *)stream)
        ;
        nni_mtx_unlock((nni_mtx *)(aio->a_iov + 2));
      }
      else {
        nng_stream_listener_accept((nng_stream_listener *)aio[1].a_iov[5].iov_buf,(nng_aio *)stream)
        ;
        nni_mtx_unlock((nni_mtx *)(aio->a_iov + 2));
      }
    }
    else {
      nng_stream_free((nng_stream *)sc);
      nni_mtx_unlock((nni_mtx *)(aio->a_iov + 2));
    }
  }
  else {
    if ((aio->a_iov[4].iov_len & 1) == 0) {
      nng_stream_listener_accept((nng_stream_listener *)aio[1].a_iov[5].iov_buf,(nng_aio *)stream);
    }
    nni_mtx_unlock((nni_mtx *)(aio->a_iov + 2));
  }
  return;
}

Assistant:

static void
http_server_acccb(void *arg)
{
	nni_http_server *s   = arg;
	nni_aio         *aio = &s->accaio;
	nng_stream      *stream;
	http_sconn      *sc;
	int              rv;

	nni_mtx_lock(&s->mtx);
	if ((rv = nni_aio_result(aio)) != 0) {
		if (!s->closed) {
			// try again?
			nng_stream_listener_accept(s->listener, aio);
		}
		nni_mtx_unlock(&s->mtx);
		return;
	}
	stream = nni_aio_get_output(aio, 0);
	if (s->closed) {
		// If we're closing, then reject this one.
		nng_stream_free(stream);
		nni_mtx_unlock(&s->mtx);
		return;
	}
	if (http_sconn_init(&sc, stream) != 0) {
		// The stream structure is already cleaned up.
		// Start another accept attempt.
		nng_stream_listener_accept(s->listener, aio);
		nni_mtx_unlock(&s->mtx);
		return;
	}
	sc->server = s;
	nni_list_append(&s->conns, sc);

	sc->handler = NULL;
	nni_http_read_req(sc->conn, &sc->rxaio);
	nng_stream_listener_accept(s->listener, aio);
	nni_mtx_unlock(&s->mtx);
}